

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O2

void __thiscall QNetworkAccessCache::clear(QNetworkAccessCache *this)

{
  void *pvVar1;
  long in_FS_OFFSET;
  piter local_40;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = *(Data **)(this + 0x10);
  if ((local_30.d != (Data *)0x0) &&
     (((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10));
  local_40 = (piter)QHash<QByteArray,_QNetworkAccessCache::Node_*>::begin(&local_30);
  while (local_40.d != (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0 ||
         local_40.bucket != 0) {
    QByteArray::clear();
    (**(code **)(**(long **)(*(long *)((local_40.d)->spans[local_40.bucket >> 7].entries
                                       [(local_40.d)->spans[local_40.bucket >> 7].offsets
                                        [(uint)local_40.bucket & 0x7f]].storage.data + 0x18) + 0x38)
                + 0x10))();
    pvVar1 = *(void **)((local_40.d)->spans[local_40.bucket >> 7].entries
                        [(local_40.d)->spans[local_40.bucket >> 7].offsets
                         [(uint)local_40.bucket & 0x7f]].storage.data + 0x18);
    if (pvVar1 != (void *)0x0) {
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)((long)pvVar1 + 0x10));
    }
    operator_delete(pvVar1,0x48);
    QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::operator++
              (&local_40);
  }
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear(&local_30);
  QBasicTimer::stop();
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::~QHash(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCache::clear()
{
    NodeHash hashCopy = hash;
    hash.clear();

    // remove all entries
    NodeHash::Iterator it = hashCopy.begin();
    NodeHash::Iterator end = hashCopy.end();
    for ( ; it != end; ++it) {
        (*it)->object->key.clear();
        (*it)->object->dispose();
        delete (*it);
    }

    // now delete:
    hashCopy.clear();

    timer.stop();

    firstExpiringNode = lastExpiringNode = nullptr;
}